

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int save_code(ofstream *file)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  ofstream *file_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<node,_std::allocator<node>_>::size(&grid);
    if (sVar1 <= local_14) break;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)file,local_14);
    std::operator<<(poVar2,'{');
    local_18 = 0;
    while( true ) {
      pvVar3 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_14);
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pvVar3->inputCode);
      if (sVar1 <= local_18) break;
      pvVar3 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_14);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&pvVar3->inputCode,(ulong)local_18);
      poVar2 = std::operator<<((ostream *)file,(string *)pvVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_18 = local_18 + 1;
    }
    poVar2 = std::operator<<((ostream *)file,'}');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return 0;
}

Assistant:

int save_code(ofstream *file){
  for(unsigned int i=0;i<grid.size();i++){
    *file << i << '{';
    for(unsigned int j=0;j<grid[i].inputCode.size();j++){
      *file << grid[i].inputCode[j] << std::endl;
    }
    *file << '}' << std::endl;
  } 
  return 0;
}